

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base.cpp
# Opt level: O2

bool __thiscall
embree::SubdivPatch1Base::updateEdgeLevels
          (SubdivPatch1Base *this,float *edge_level,int *subdiv,SubdivMesh *mesh,int simd_width)

{
  float *level;
  byte bVar1;
  size_t i;
  long lVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  float new_level [4];
  Vec2i res;
  float local_38 [4];
  uint local_28;
  uint local_24;
  
  computeEdgeLevels(edge_level,subdiv,local_38);
  level = this->level;
  bVar4 = false;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    bVar4 = (bool)(bVar4 | (int)local_38[lVar2] != (int)level[lVar2]);
    level[lVar2] = local_38[lVar2];
  }
  computeGridSize(level);
  this->grid_u_res = (unsigned_short)local_28;
  local_28 = local_28 & 0xffff;
  uVar3 = local_24 & 0xffff;
  this->grid_v_res = (unsigned_short)local_24;
  this->grid_size_simd_blocks =
       (unsigned_short)((int)(-simd_width & (simd_width + uVar3 * local_28) - 1) / simd_width);
  bVar1 = this->flags;
  this->flags = bVar1 & 0xef;
  if ((((int)this->level[0] + 1 < (int)local_28) || ((int)this->level[2] + 1 < (int)local_28)) ||
     (iVar5 = (int)this->level[3] + 1, iVar6 = (int)this->level[1] + 1,
     auVar7._0_4_ = -(uint)(iVar5 < (int)uVar3), auVar7._4_4_ = -(uint)(iVar5 < (int)uVar3),
     auVar7._8_4_ = -(uint)(iVar6 < (int)uVar3), auVar7._12_4_ = -(uint)(iVar6 < (int)uVar3),
     iVar5 = movmskpd(uVar3,auVar7), iVar5 != 0)) {
    this->flags = bVar1 | 0x10;
  }
  return bVar4;
}

Assistant:

bool SubdivPatch1Base::updateEdgeLevels(const float edge_level[4], const int subdiv[4], const SubdivMesh *const mesh, const int simd_width)
  {
    /* calculate edge levels */
    float new_level[4];
    computeEdgeLevels(edge_level,subdiv,new_level);

    /* calculate if tessellation pattern changed */
    bool grid_changed = false;
    for (size_t i=0; i<4; i++) {
      grid_changed |= (int)new_level[i] != (int)level[i]; 
      level[i] = new_level[i];
    }

    /* compute grid resolution */
    Vec2i res = computeGridSize(level);
    grid_u_res = res.x; grid_v_res = res.y;
    grid_size_simd_blocks = ((grid_u_res*grid_v_res+simd_width-1)&(-simd_width)) / simd_width;

    /* need stiching? */
    flags &= ~TRANSITION_PATCH;
    const int int_edge_points0 = (int)level[0] + 1;
    const int int_edge_points1 = (int)level[1] + 1;
    const int int_edge_points2 = (int)level[2] + 1;
    const int int_edge_points3 = (int)level[3] + 1;
    if (int_edge_points0 < (int)grid_u_res ||
	int_edge_points2 < (int)grid_u_res ||
	int_edge_points1 < (int)grid_v_res ||
	int_edge_points3 < (int)grid_v_res) {
      flags |= TRANSITION_PATCH;
    }

    return grid_changed;
  }